

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::InputScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_step,
                       void *p_step_fast,char *format,ImGuiInputTextFlags flags)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  void *output;
  char *text;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  char *text_end;
  void *pvVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  char buf [64];
  ImVec2 local_98;
  void *local_90;
  void *local_88;
  char *local_80;
  char local_78 [72];
  
  pIVar2 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  if (pIVar2->CurrentWindow->SkipItems == false) {
    if (format == (char *)0x0) {
      format = GDataTypeInfo[data_type].PrintFmt;
    }
    local_90 = p_step_fast;
    DataTypeFormatString(local_78,0x40,data_type,p_data,format);
    local_88 = p_data;
    if ((flags & 0x20003U) == 0 && pIVar2->ActiveId == 0) {
      uVar5 = 0x20000;
      if ((data_type & 0xfffffffeU) != 8) {
        if (*format == '\0') {
          uVar5 = 1;
        }
        else {
          sVar6 = strlen(format);
          uVar5 = ((format[sVar6 - 1] & 0xdfU) == 0x58) + 1;
        }
      }
      flags = flags | uVar5;
    }
    if (p_step == (void *)0x0) {
      local_98.x = 0.0;
      local_98.y = 0.0;
      bVar4 = false;
      bVar3 = InputTextEx(label,(char *)0x0,local_78,0x40,&local_98,flags | 0x8000010U,
                          (ImGuiInputTextCallback)0x0,(void *)0x0);
      if (bVar3) {
        bVar4 = DataTypeApplyFromText(local_78,data_type,local_88,format);
      }
    }
    else {
      fVar8 = GetFrameHeight();
      BeginGroup();
      local_80 = label;
      PushID(label);
      fVar9 = CalcItemWidth();
      fVar10 = (pIVar2->Style).ItemInnerSpacing.x + fVar8;
      fVar9 = fVar9 - (fVar10 + fVar10);
      fVar10 = 1.0;
      if (1.0 <= fVar9) {
        fVar10 = fVar9;
      }
      SetNextItemWidth(fVar10);
      local_98.x = 0.0;
      local_98.y = 0.0;
      bVar4 = false;
      bVar3 = InputTextEx("",(char *)0x0,local_78,0x40,&local_98,flags | 0x8000010U,
                          (ImGuiInputTextCallback)0x0,(void *)0x0);
      output = local_88;
      if (bVar3) {
        bVar4 = DataTypeApplyFromText(local_78,data_type,local_88,format);
      }
      IVar1 = (pIVar2->Style).FramePadding;
      (pIVar2->Style).FramePadding.x = (pIVar2->Style).FramePadding.y;
      if (((uint)flags >> 0xe & 1) != 0) {
        BeginDisabled(true);
      }
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
      local_98.y = fVar8;
      local_98.x = fVar8;
      bVar3 = ButtonEx("-",&local_98,0x2400);
      if (bVar3) {
        pvVar7 = p_step;
        if ((pIVar2->IO).KeyCtrl != false) {
          pvVar7 = local_90;
        }
        if (local_90 == (void *)0x0) {
          pvVar7 = p_step;
        }
        DataTypeApplyOp(data_type,0x2d,output,output,pvVar7);
        bVar4 = true;
      }
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
      bVar3 = ButtonEx("+",&local_98,0x2400);
      if (bVar3) {
        pvVar7 = p_step;
        if ((pIVar2->IO).KeyCtrl != false) {
          pvVar7 = local_90;
        }
        if (local_90 == (void *)0x0) {
          pvVar7 = p_step;
        }
        DataTypeApplyOp(data_type,0x2b,output,output,pvVar7);
        bVar4 = true;
      }
      if (((uint)flags >> 0xe & 1) != 0) {
        EndDisabled();
      }
      text = local_80;
      text_end = FindRenderedTextEnd(local_80,(char *)0x0);
      if (text_end != text) {
        SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
        TextEx(text,text_end,0);
      }
      (pIVar2->Style).FramePadding = IVar1;
      PopID();
      EndGroup();
    }
    if (bVar4 != false) {
      MarkItemEdited((pIVar2->LastItemData).ID);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::InputScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_step, const void* p_step_fast, const char* format, ImGuiInputTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;

    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;

    char buf[64];
    DataTypeFormatString(buf, IM_ARRAYSIZE(buf), data_type, p_data, format);

    // Testing ActiveId as a minor optimization as filtering is not needed until active
    if (g.ActiveId == 0 && (flags & (ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsScientific)) == 0)
        flags |= InputScalar_DefaultCharsFilter(data_type, format);
    flags |= ImGuiInputTextFlags_AutoSelectAll | ImGuiInputTextFlags_NoMarkEdited; // We call MarkItemEdited() ourselves by comparing the actual data rather than the string.

    bool value_changed = false;
    if (p_step != NULL)
    {
        const float button_size = GetFrameHeight();

        BeginGroup(); // The only purpose of the group here is to allow the caller to query item data e.g. IsItemActive()
        PushID(label);
        SetNextItemWidth(ImMax(1.0f, CalcItemWidth() - (button_size + style.ItemInnerSpacing.x) * 2));
        if (InputText("", buf, IM_ARRAYSIZE(buf), flags)) // PushId(label) + "" gives us the expected ID from outside point of view
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);
        IMGUI_TEST_ENGINE_ITEM_INFO(g.LastItemData.ID, label, g.LastItemData.StatusFlags);

        // Step buttons
        const ImVec2 backup_frame_padding = style.FramePadding;
        style.FramePadding.x = style.FramePadding.y;
        ImGuiButtonFlags button_flags = ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups;
        if (flags & ImGuiInputTextFlags_ReadOnly)
            BeginDisabled();
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '-', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '+', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        if (flags & ImGuiInputTextFlags_ReadOnly)
            EndDisabled();

        const char* label_end = FindRenderedTextEnd(label);
        if (label != label_end)
        {
            SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_end);
        }
        style.FramePadding = backup_frame_padding;

        PopID();
        EndGroup();
    }
    else
    {
        if (InputText(label, buf, IM_ARRAYSIZE(buf), flags))
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);
    }
    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    return value_changed;
}